

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void serialize_model<char*>(Imputer *model,char **out)

{
  pointer piVar1;
  pointer piVar2;
  pointer pvVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  size_t *psVar8;
  pointer pIVar9;
  size_t sVar10;
  char *__dest;
  ImputeNode *node;
  pointer node_00;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *tree;
  size_t sVar11;
  pointer pvVar12;
  
  if (!interrupt_switch) {
    piVar1 = (model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar2 = (model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar12 = (model->imputer_tree).
              super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (model->imputer_tree).
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar5 = (model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (model->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar7 = (model->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar8 = (size_t *)*out;
    sVar10 = model->ncols_categ;
    *psVar8 = model->ncols_numeric;
    psVar8[1] = sVar10;
    psVar8[2] = (long)piVar1 - (long)piVar2 >> 2;
    psVar8[3] = ((long)pvVar12 - (long)pvVar3 >> 3) * -0x5555555555555555;
    psVar8[4] = (long)pdVar4 - (long)pdVar5 >> 3;
    psVar8[5] = (long)piVar6 - (long)piVar7 >> 2;
    __dest = *out + 0x30;
    *out = __dest;
    piVar1 = (model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = (long)(model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar1;
    if (sVar11 != 0) {
      memcpy(__dest,piVar1,sVar11);
      __dest = *out + sVar11;
      *out = __dest;
    }
    pdVar4 = (model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = (long)(model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar4;
    if (sVar11 != 0) {
      memcpy(__dest,pdVar4,sVar11);
      __dest = *out + sVar11;
      *out = __dest;
    }
    piVar1 = (model->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = (long)(model->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar1;
    if (sVar11 != 0) {
      memcpy(__dest,piVar1,sVar11);
      *out = *out + sVar11;
    }
    pvVar3 = (model->imputer_tree).
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar12 = (model->imputer_tree).
                   super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar12 != pvVar3;
        pvVar12 = pvVar12 + 1) {
      *(long *)*out =
           ((long)(pvVar12->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar12->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      *out = *out + 8;
      pIVar9 = (pvVar12->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (node_00 = (pvVar12->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar9; node_00 = node_00 + 1) {
        serialize_node<char*>(node_00,out);
      }
    }
  }
  return;
}

Assistant:

void serialize_model(const Imputer &model, otype &out)
{
    if (interrupt_switch) return;

    size_t data_sizets[] = {
        model.ncols_numeric,
        model.ncols_categ,
        model.ncat.size(),
        model.imputer_tree.size(),
        model.col_means.size(),
        model.col_modes.size()
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)6, out);

    write_bytes<int>((void*)model.ncat.data(), model.ncat.size(), out);

    write_bytes<double>((void*)model.col_means.data(), model.col_means.size(), out);

    write_bytes<int>((void*)model.col_modes.data(), model.col_modes.size(), out);

    size_t veclen;
    for (const auto &tree : model.imputer_tree) {
        veclen = tree.size();
        write_bytes<size_t>((void*)&veclen, (size_t)1, out);
        for (const auto &node : tree)
            serialize_node(node, out);
    }
}